

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadStringTemplateCallsiteConstant
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function,Var *var)

{
  JavascriptLibrary *pJVar1;
  JavascriptString *pJVar2;
  JavascriptArray *pJVar3;
  JavascriptString *str_1;
  int i_1;
  JavascriptArray *rawArray;
  JavascriptString *str;
  int i;
  uint32 rawlen;
  uint32 len;
  LPCWSTR string;
  JavascriptArray *callsite;
  ScriptContext *scriptContext;
  Var *ppvStack_28;
  int arrayLength;
  Var *var_local;
  FunctionBody *function_local;
  byte *current_local;
  ByteCodeBufferReader *this_local;
  
  scriptContext._4_4_ = 0;
  ppvStack_28 = var;
  var_local = (Var *)function;
  function_local = (FunctionBody *)current;
  current_local = (byte *)this;
  function_local = (FunctionBody *)ReadInt32(this,current,(int *)((long)&scriptContext + 4));
  callsite = (JavascriptArray *)FunctionProxy::GetScriptContext((FunctionProxy *)var_local);
  EnterPinnedScope(&string);
  pJVar1 = ScriptContext::GetLibrary((ScriptContext *)callsite);
  string = (LPCWSTR)JavascriptLibrary::CreateArray(pJVar1,scriptContext._4_4_);
  for (str._4_4_ = 0; str._4_4_ < (int)scriptContext._4_4_; str._4_4_ = str._4_4_ + 1) {
    function_local =
         (FunctionBody *)
         ReadStringConstant(this,(byte *)function_local,(FunctionBody *)var_local,(LPCWSTR *)&rawlen
                            ,(uint32 *)&i);
    pJVar2 = JavascriptString::NewCopyBuffer(_rawlen,i,(ScriptContext *)callsite);
    (**(code **)(*(long *)string + 0x358))(string,str._4_4_,pJVar2);
  }
  pJVar1 = ScriptContext::GetLibrary((ScriptContext *)callsite);
  pJVar3 = JavascriptLibrary::CreateArray(pJVar1,scriptContext._4_4_);
  for (str_1._4_4_ = 0; (int)str_1._4_4_ < (int)scriptContext._4_4_; str_1._4_4_ = str_1._4_4_ + 1)
  {
    function_local =
         (FunctionBody *)
         ReadStringConstant(this,(byte *)function_local,(FunctionBody *)var_local,(LPCWSTR *)&rawlen
                            ,(uint32 *)&i);
    pJVar2 = JavascriptString::NewCopyBuffer(_rawlen,i,(ScriptContext *)callsite);
    (*(pJVar3->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])
              (pJVar3,(ulong)str_1._4_4_,pJVar2);
  }
  (*(pJVar3->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x38])();
  (**(code **)(*(long *)string + 0xf0))(string,0x12a,pJVar3,0,0,0,0xf);
  (**(code **)(*(long *)string + 0x1c0))();
  *ppvStack_28 = string;
  LeavePinnedScope();
  return (byte *)function_local;
}

Assistant:

const byte* ReadStringTemplateCallsiteConstant(const byte* current, FunctionBody* function, Var& var)
    {
        int arrayLength = 0;
        current = ReadInt32(current, &arrayLength);

        ScriptContext* scriptContext = function->GetScriptContext();

        ENTER_PINNED_SCOPE(Js::JavascriptArray, callsite);
        callsite = scriptContext->GetLibrary()->CreateArray(arrayLength);

        LPCWSTR string;
        uint32 len;
        uint32 rawlen = 0;

        for (int i = 0; i < arrayLength; i++)
        {
            current = ReadStringConstant(current, function, &string, &len);
            JavascriptString* str = JavascriptString::NewCopyBuffer(string, len, scriptContext);
            callsite->SetItemWithAttributes(i, str, PropertyEnumerable);
        }

        JavascriptArray* rawArray = scriptContext->GetLibrary()->CreateArray(arrayLength);

        for (int i = 0; i < arrayLength; i++)
        {
            current = ReadStringConstant(current, function, &string, &len);
            rawlen += len;

            JavascriptString* str = JavascriptString::NewCopyBuffer(string, len, scriptContext);
            rawArray->SetItemWithAttributes(i, str, PropertyEnumerable);
        }

        rawArray->Freeze();
        callsite->SetPropertyWithAttributes(Js::PropertyIds::raw, rawArray, PropertyNone, nullptr);
        callsite->Freeze();

        var = callsite;
        LEAVE_PINNED_SCOPE();

        return current;
    }